

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O3

int read_client_close_proxy(archive_read *a)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  
  iVar2 = 0;
  if (((a->client).closer != (undefined1 *)0x0) && (iVar2 = 0, (a->client).nodes != 0)) {
    uVar3 = 0;
    lVar4 = 0x10;
    iVar2 = 0;
    do {
      iVar1 = (*(code *)(a->client).closer)
                        (a,*(undefined8 *)((long)&((a->client).dataset)->begin_position + lVar4));
      if (iVar1 <= iVar2) {
        iVar2 = iVar1;
      }
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x18;
    } while (uVar3 < (a->client).nodes);
  }
  return iVar2;
}

Assistant:

static int
read_client_close_proxy(struct archive_read *a)
{
	int r = ARCHIVE_OK, r2;
	unsigned int i;

	if (a->client.closer == NULL)
		return (r);
	for (i = 0; i < a->client.nodes; i++)
	{
		r2 = (a->client.closer)
			((struct archive *)a, a->client.dataset[i].data);
		if (r > r2)
			r = r2;
	}
	return (r);
}